

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O0

uint32 rw::xbox::getSizeNativeTexture(Texture *tex)

{
  int32 iVar1;
  int32 iVar2;
  int32 local_1c;
  int32 i;
  int32 levels;
  uint32 size;
  Texture *tex_local;
  
  i = 0x68;
  iVar1 = Raster::getNumLevels(tex->raster);
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    iVar2 = getLevelSize(tex->raster,local_1c);
    i = iVar2 + i;
  }
  i = i + 3U & 0xfffffffc;
  if ((tex->raster->format & 0x4000U) == 0) {
    if ((tex->raster->format & 0x2000U) != 0) {
      i = i + 0x400;
    }
  }
  else {
    i = i + 0x80;
  }
  return i;
}

Assistant:

uint32
getSizeNativeTexture(Texture *tex)
{
	uint32 size = 12 + 72 + 16 + 4;
	int32 levels = tex->raster->getNumLevels();
	for(int32 i = 0; i < levels; i++)
		size += getLevelSize(tex->raster, i);
	size = (size+3)&~3;
	if(tex->raster->format & Raster::PAL4)
		size += 4*32;
	else if(tex->raster->format & Raster::PAL8)
		size += 4*256;
	return size;
}